

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EdExplFinder.cpp
# Opt level: O0

void __thiscall EdExplFinder::clean_data_structures(EdExplFinder *this)

{
  void *pvVar1;
  long in_RDI;
  
  pvVar1 = *(void **)(in_RDI + 0x30);
  if (pvVar1 != (void *)0x0) {
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x1dc83c);
    operator_delete(pvVar1);
  }
  pvVar1 = *(void **)(in_RDI + 0x38);
  if (pvVar1 != (void *)0x0) {
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x1dc864);
    operator_delete(pvVar1);
  }
  return;
}

Assistant:

void EdExplFinder::clean_data_structures() {
	delete seq1ExcludedCharacters;
	delete seq2ExcludedCharacters;
}